

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprintint.h
# Opt level: O3

int print_uint32(uint32_t n,char *p)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  uint32_t uVar4;
  ulong uVar5;
  uint uVar6;
  bool bVar7;
  
  uVar4 = n;
  if (9999 < n) {
    if (9999999 < n) {
      if (999999999 < n) {
        p[10] = '\0';
        *(undefined2 *)(p + 8) =
             *(undefined2 *)
              (
              "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
              + (ulong)(n % 100) * 2);
        uVar2 = 10;
        n = n / 100;
        goto switchD_0011923e_caseD_8;
      }
      bVar7 = n < 100000000;
      iVar1 = 8;
      goto LAB_0011920d;
    }
    if (n < 1000000) {
      bVar7 = n < 100000;
      iVar1 = 5;
      goto LAB_0011920d;
    }
    p[7] = '\0';
    pcVar3 = p + 7;
    uVar2 = 7;
    goto switchD_001192f2_caseD_7;
  }
  if (n < 100) {
    bVar7 = n < 10;
    iVar1 = 1;
  }
  else {
    bVar7 = n < 1000;
    iVar1 = 3;
  }
LAB_0011920d:
  uVar2 = (iVar1 + 1) - (uint)bVar7;
  uVar5 = (ulong)uVar2;
  pcVar3 = p + uVar5;
  p[uVar5] = '\0';
  if ((uVar2 & 1) == 0) {
    uVar6 = n;
    switch(uVar2) {
    case 8:
switchD_0011923e_caseD_8:
      *(undefined2 *)(p + 6) =
           *(undefined2 *)
            (
            "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            + (ulong)(n % 100) * 2);
      uVar5 = 6;
      n = n / 100;
    case 6:
      pcVar3 = p + (uVar5 - 2);
      *(undefined2 *)pcVar3 =
           *(undefined2 *)
            (
            "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            + (ulong)(n % 100) * 2);
      uVar6 = n / 100;
    case 4:
      n = uVar6 / 100;
      *(undefined2 *)(pcVar3 + -2) =
           *(undefined2 *)
            (
            "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            + (ulong)(uVar6 % 100) * 2);
      pcVar3 = pcVar3 + -2;
    case 2:
      *(undefined2 *)(pcVar3 + -2) =
           *(undefined2 *)
            (
            "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            + (ulong)(n % 100) * 2);
    }
switchD_0011923e_caseD_3:
    return uVar2;
  }
  switch(uVar2) {
  case 1:
    break;
  default:
    goto switchD_0011923e_caseD_3;
  case 9:
    uVar4 = n / 100;
    *(undefined2 *)(pcVar3 + -2) =
         *(undefined2 *)
          (
          "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
          + (ulong)(n % 100) * 2);
    pcVar3 = pcVar3 + -2;
    uVar2 = 9;
  case 7:
switchD_001192f2_caseD_7:
    n = uVar4 / 100;
    *(undefined2 *)(pcVar3 + -2) =
         *(undefined2 *)
          (
          "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
          + (ulong)(uVar4 % 100) * 2);
    pcVar3 = pcVar3 + -2;
  case 5:
    uVar4 = n / 100;
    *(undefined2 *)(pcVar3 + -2) =
         *(undefined2 *)
          (
          "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
          + (ulong)(n % 100) * 2);
    pcVar3 = pcVar3 + -2;
  case 3:
    n = uVar4 / 100;
    *(undefined2 *)(pcVar3 + -2) =
         *(undefined2 *)
          (
          "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
          + (ulong)(uVar4 % 100) * 2);
    pcVar3 = pcVar3 + -2;
  }
  pcVar3[-1] = (char)n + '0';
  return uVar2;
}

Assistant:

static int print_uint32(uint32_t n, char *p)
{
    int k = 0;
    const char *dp;

    if(n >= 10000UL) {
        if(n >= 10000000UL) {
            if(n >= 1000000000UL) {
                k = 10;
            } else if(n >= 100000000UL) {
                k = 9;
            } else {
               k = 8;
            }
        } else {
            if(n >= 1000000UL) {
                k = 7;
            } else if(n >= 100000UL) {
                k = 6;
            } else {
                k = 5;
            }
        }
    } else {
        if(n >= 100UL) {
            if(n >= 1000UL) {
                k = 4;
            } else {
                k = 3;
            }
        } else {
            if(n >= 10UL) {
                k = 2;
            } else {
                k = 1UL;
            }
        }
    }
    p += k;
    *p = '\0';
    if (k & 1) {
        switch (k) {
        case 9:
            __print_stage();
	    pattribute(fallthrough);
        case 7:
            __print_stage();
	    pattribute(fallthrough);
        case 5:
            __print_stage();
	    pattribute(fallthrough);
        case 3:
            __print_stage();
	    pattribute(fallthrough);
        case 1:
            p[-1] = (char)n + '0';
        }
    } else {
        switch (k) {
        case 10:
            __print_stage();
	    pattribute(fallthrough);
        case 8:
            __print_stage();
	    pattribute(fallthrough);
        case 6:
            __print_stage();
	    pattribute(fallthrough);
        case 4:
            __print_stage();
	    pattribute(fallthrough);
        case 2:
            __print_stage();
        }
    }
    return k;
}